

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::merge_with(Tree *this,Tree *src,size_t src_node,size_t dst_node)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  bool bVar6;
  NodeData *pNVar7;
  size_t sVar8;
  size_t sVar9;
  csubstr *pcVar10;
  size_t sVar11;
  long lVar12;
  char *pcVar13;
  undefined8 uVar14;
  char *pcVar15;
  byte bVar16;
  csubstr cVar17;
  char msg [31];
  undefined1 uStack_c9;
  size_t local_60;
  size_t local_38;
  
  bVar16 = 0;
  if (src == (Tree *)0x0) {
    builtin_strncpy(msg + 0x10,"rc != nullpt",0xc);
    stack0xffffffffffffff34 = CONCAT13(uStack_c9,0x2972);
    builtin_strncpy(msg,"check failed: (s",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar17 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_38 = cVar17.len;
    auVar4 = ZEXT1224(ZEXT412(0x662e) << 0x40);
    LVar3.name.str._0_4_ = (int)cVar17.str;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = cVar17.str._4_4_;
    LVar3.name.len = local_38;
    (*p_Var1)(msg,0x1f,LVar3,(this->m_callbacks).m_user_data);
  }
  if (src_node == 0xffffffffffffffff) {
    src_node = root_id(src);
  }
  if (dst_node == 0xffffffffffffffff) {
    dst_node = root_id(this);
  }
  pNVar7 = _p(src,src_node);
  if (((pNVar7->m_type).type & VAL) == NOTYPE) {
    pNVar7 = _p(src,src_node);
    if (((pNVar7->m_type).type & SEQ) == NOTYPE) {
      pNVar7 = _p(src,src_node);
      if (((pNVar7->m_type).type & MAP) == NOTYPE) {
        pcVar13 = 
        "check failed: (src->has_val(src_node) || src->is_seq(src_node) || src->is_map(src_node))";
        pcVar15 = msg;
        for (lVar12 = 0x59; lVar12 != 0; lVar12 = lVar12 + -1) {
          *pcVar15 = *pcVar13;
          pcVar13 = pcVar13 + (ulong)bVar16 * -2 + 1;
          pcVar15 = pcVar15 + (ulong)bVar16 * -2 + 1;
        }
        if (((byte)s_error_flags & 1) != 0) {
          bVar6 = is_debugger_attached();
          if (bVar6) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar17 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_60 = cVar17.len;
        auVar4 = ZEXT1224(ZEXT412(0x6633) << 0x40);
        LVar5.name.str._0_4_ = (int)cVar17.str;
        LVar5.super_LineCol.offset = auVar4._0_8_;
        LVar5.super_LineCol.line = auVar4._8_8_;
        LVar5.super_LineCol.col = auVar4._16_8_;
        LVar5.name.str._4_4_ = cVar17.str._4_4_;
        LVar5.name.len = local_60;
        (*p_Var1)(msg,0x59,LVar5,(this->m_callbacks).m_user_data);
      }
    }
  }
  pNVar7 = _p(src,src_node);
  if (((pNVar7->m_type).type & VAL) == NOTYPE) {
    pNVar7 = _p(src,src_node);
    if (((pNVar7->m_type).type & SEQ) == NOTYPE) {
      pNVar7 = _p(src,src_node);
      if (((pNVar7->m_type).type & MAP) == NOTYPE) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar6 = is_debugger_attached();
          if (bVar6) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
        }
        uVar14 = 0x666f;
LAB_001b7b5d:
        handle_error(0x1f8aa3,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,uVar14);
      }
      pNVar7 = _p(this,dst_node);
      if (((pNVar7->m_type).type & MAP) == NOTYPE) {
        bVar6 = has_children(this,dst_node);
        if (bVar6) {
          remove_children(this,dst_node);
        }
        _clear_type(this,dst_node);
        pNVar7 = _p(src,src_node);
        if (((pNVar7->m_type).type & KEY) == NOTYPE) {
          to_map(this,dst_node,0);
        }
        else {
          pcVar10 = key(src,src_node);
          to_map(this,dst_node,*pcVar10,0);
        }
      }
      for (sVar9 = first_child(src,src_node); sVar9 != 0xffffffffffffffff;
          sVar9 = next_sibling(src,sVar9)) {
        pcVar10 = key(src,sVar9);
        sVar11 = find_child(this,dst_node,pcVar10);
        if (sVar11 == 0xffffffffffffffff) {
          pNVar7 = _p(this,dst_node);
          sVar8 = pNVar7->m_last_child;
          if (dst_node == 0xffffffffffffffff) {
            if (((byte)s_error_flags & 1) != 0) {
              bVar6 = is_debugger_attached();
              if (bVar6) {
                pcVar2 = (code *)swi(3);
                (*pcVar2)();
                return;
              }
            }
            cVar17 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
            msg[0] = '\0';
            msg[1] = '\0';
            msg[2] = '\0';
            msg[3] = '\0';
            msg[4] = '\0';
            msg[5] = '\0';
            msg[6] = '\0';
            msg[7] = '\0';
            msg[8] = -0x4f;
            msg[9] = 'L';
            msg[10] = '\0';
            msg[0xb] = '\0';
            msg[0xc] = '\0';
            msg[0xd] = '\0';
            msg[0xe] = '\0';
            msg[0xf] = '\0';
            msg[0x10] = '\0';
            msg[0x11] = '\0';
            msg[0x12] = '\0';
            msg[0x13] = '\0';
            msg[0x14] = '\0';
            msg[0x15] = '\0';
            msg[0x16] = '\0';
            msg[0x17] = '\0';
            msg._24_4_ = cVar17.str._0_4_;
            stack0xffffffffffffff34 = cVar17.str._4_4_;
            (*(code *)PTR_error_impl_0022e4f8)
                      ("check failed: parent != NONE",0x1c,
                       (anonymous_namespace)::s_default_callbacks);
          }
          pNVar7 = _p(this,dst_node);
          if (((pNVar7->m_type).type & (STREAM|MAP)) == NOTYPE) {
            bVar6 = is_root(this,dst_node);
            if (!bVar6) {
              if (((byte)s_error_flags & 1) != 0) {
                bVar6 = is_debugger_attached();
                if (bVar6) {
                  pcVar2 = (code *)swi(3);
                  (*pcVar2)();
                  return;
                }
              }
              cVar17 = to_csubstr(
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 );
              msg[0] = '\0';
              msg[1] = '\0';
              msg[2] = '\0';
              msg[3] = '\0';
              msg[4] = '\0';
              msg[5] = '\0';
              msg[6] = '\0';
              msg[7] = '\0';
              msg[8] = -0x4e;
              msg[9] = 'L';
              msg[10] = '\0';
              msg[0xb] = '\0';
              msg[0xc] = '\0';
              msg[0xd] = '\0';
              msg[0xe] = '\0';
              msg[0xf] = '\0';
              msg[0x10] = '\0';
              msg[0x11] = '\0';
              msg[0x12] = '\0';
              msg[0x13] = '\0';
              msg[0x14] = '\0';
              msg[0x15] = '\0';
              msg[0x16] = '\0';
              msg[0x17] = '\0';
              msg._24_4_ = cVar17.str._0_4_;
              stack0xffffffffffffff34 = cVar17.str._4_4_;
              (*(code *)PTR_error_impl_0022e4f8)
                        ("check failed: is_container(parent) || is_root(parent)",0x35,
                         (anonymous_namespace)::s_default_callbacks);
            }
          }
          if (sVar8 != 0xffffffffffffffff) {
            pNVar7 = _p(this,sVar8);
            if (pNVar7->m_parent != dst_node) {
              if (((byte)s_error_flags & 1) != 0) {
                bVar6 = is_debugger_attached();
                if (bVar6) {
                  pcVar2 = (code *)swi(3);
                  (*pcVar2)();
                  return;
                }
              }
              cVar17 = to_csubstr(
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 );
              msg[0] = '\0';
              msg[1] = '\0';
              msg[2] = '\0';
              msg[3] = '\0';
              msg[4] = '\0';
              msg[5] = '\0';
              msg[6] = '\0';
              msg[7] = '\0';
              msg[8] = -0x4d;
              msg[9] = 'L';
              msg[10] = '\0';
              msg[0xb] = '\0';
              msg[0xc] = '\0';
              msg[0xd] = '\0';
              msg[0xe] = '\0';
              msg[0xf] = '\0';
              msg[0x10] = '\0';
              msg[0x11] = '\0';
              msg[0x12] = '\0';
              msg[0x13] = '\0';
              msg[0x14] = '\0';
              msg[0x15] = '\0';
              msg[0x16] = '\0';
              msg[0x17] = '\0';
              msg._24_4_ = cVar17.str._0_4_;
              stack0xffffffffffffff34 = cVar17.str._4_4_;
              (*(code *)PTR_error_impl_0022e4f8)
                        ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                         (anonymous_namespace)::s_default_callbacks);
            }
          }
          sVar11 = _claim(this);
          _set_hierarchy(this,sVar11,dst_node,sVar8);
          _copy_props(this,sVar11,src,sVar9);
        }
        merge_with(this,src,sVar9,sVar11);
      }
    }
    else {
      pNVar7 = _p(this,dst_node);
      if (((pNVar7->m_type).type & SEQ) == NOTYPE) {
        bVar6 = has_children(this,dst_node);
        if (bVar6) {
          remove_children(this,dst_node);
        }
        _clear_type(this,dst_node);
        pNVar7 = _p(src,src_node);
        if (((pNVar7->m_type).type & KEY) == NOTYPE) {
          to_seq(this,dst_node,0);
        }
        else {
          pcVar10 = key(src,src_node);
          to_seq(this,dst_node,*pcVar10,0);
        }
      }
      for (sVar9 = first_child(src,src_node); sVar9 != 0xffffffffffffffff;
          sVar9 = next_sibling(src,sVar9)) {
        pNVar7 = _p(this,dst_node);
        sVar11 = pNVar7->m_last_child;
        if (dst_node == 0xffffffffffffffff) {
          if (((byte)s_error_flags & 1) != 0) {
            bVar6 = is_debugger_attached();
            if (bVar6) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
          }
          cVar17 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x4f;
          msg[9] = 'L';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg._24_4_ = cVar17.str._0_4_;
          stack0xffffffffffffff34 = cVar17.str._4_4_;
          (*(code *)PTR_error_impl_0022e4f8)
                    ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks)
          ;
        }
        pNVar7 = _p(this,dst_node);
        if (((pNVar7->m_type).type & (STREAM|MAP)) == NOTYPE) {
          bVar6 = is_root(this,dst_node);
          if (!bVar6) {
            if (((byte)s_error_flags & 1) != 0) {
              bVar6 = is_debugger_attached();
              if (bVar6) {
                pcVar2 = (code *)swi(3);
                (*pcVar2)();
                return;
              }
            }
            cVar17 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
            msg[0] = '\0';
            msg[1] = '\0';
            msg[2] = '\0';
            msg[3] = '\0';
            msg[4] = '\0';
            msg[5] = '\0';
            msg[6] = '\0';
            msg[7] = '\0';
            msg[8] = -0x4e;
            msg[9] = 'L';
            msg[10] = '\0';
            msg[0xb] = '\0';
            msg[0xc] = '\0';
            msg[0xd] = '\0';
            msg[0xe] = '\0';
            msg[0xf] = '\0';
            msg[0x10] = '\0';
            msg[0x11] = '\0';
            msg[0x12] = '\0';
            msg[0x13] = '\0';
            msg[0x14] = '\0';
            msg[0x15] = '\0';
            msg[0x16] = '\0';
            msg[0x17] = '\0';
            msg._24_4_ = cVar17.str._0_4_;
            stack0xffffffffffffff34 = cVar17.str._4_4_;
            (*(code *)PTR_error_impl_0022e4f8)
                      ("check failed: is_container(parent) || is_root(parent)",0x35,
                       (anonymous_namespace)::s_default_callbacks);
          }
        }
        if (sVar11 != 0xffffffffffffffff) {
          pNVar7 = _p(this,sVar11);
          if (pNVar7->m_parent != dst_node) {
            if (((byte)s_error_flags & 1) != 0) {
              bVar6 = is_debugger_attached();
              if (bVar6) {
                pcVar2 = (code *)swi(3);
                (*pcVar2)();
                return;
              }
            }
            cVar17 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
            msg[0] = '\0';
            msg[1] = '\0';
            msg[2] = '\0';
            msg[3] = '\0';
            msg[4] = '\0';
            msg[5] = '\0';
            msg[6] = '\0';
            msg[7] = '\0';
            msg[8] = -0x4d;
            msg[9] = 'L';
            msg[10] = '\0';
            msg[0xb] = '\0';
            msg[0xc] = '\0';
            msg[0xd] = '\0';
            msg[0xe] = '\0';
            msg[0xf] = '\0';
            msg[0x10] = '\0';
            msg[0x11] = '\0';
            msg[0x12] = '\0';
            msg[0x13] = '\0';
            msg[0x14] = '\0';
            msg[0x15] = '\0';
            msg[0x16] = '\0';
            msg[0x17] = '\0';
            msg._24_4_ = cVar17.str._0_4_;
            stack0xffffffffffffff34 = cVar17.str._4_4_;
            (*(code *)PTR_error_impl_0022e4f8)
                      ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                       (anonymous_namespace)::s_default_callbacks);
          }
        }
        sVar8 = _claim(this);
        _set_hierarchy(this,sVar8,dst_node,sVar11);
        _copy_props_wo_key(this,sVar8,src,sVar9);
        merge_with(this,src,sVar9,sVar8);
      }
    }
  }
  else {
    pNVar7 = _p(this,dst_node);
    if (((pNVar7->m_type).type & VAL) == NOTYPE) {
      bVar6 = has_children(this,dst_node);
      if (bVar6) {
        remove_children(this,dst_node);
      }
    }
    pNVar7 = _p(src,src_node);
    if ((~(int)(pNVar7->m_type).type & 3U) == 0) {
      _copy_props(this,dst_node,src,src_node);
    }
    else {
      pNVar7 = _p(src,src_node);
      if (((pNVar7->m_type).type & KEYVAL) != VAL) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar6 = is_debugger_attached();
          if (bVar6) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
        }
        uVar14 = 0x6641;
        goto LAB_001b7b5d;
      }
      _copy_props_wo_key(this,dst_node,src,src_node);
    }
  }
  return;
}

Assistant:

void Tree::merge_with(Tree const *src, size_t src_node, size_t dst_node)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    if(src_node == NONE)
        src_node = src->root_id();
    if(dst_node == NONE)
        dst_node = root_id();
    _RYML_CB_ASSERT(m_callbacks, src->has_val(src_node) || src->is_seq(src_node) || src->is_map(src_node));

    if(src->has_val(src_node))
    {
        if( ! has_val(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
        }
        if(src->is_keyval(src_node))
            _copy_props(dst_node, src, src_node);
        else if(src->is_val(src_node))
            _copy_props_wo_key(dst_node, src, src_node);
        else
            C4_NEVER_REACH();
    }
    else if(src->is_seq(src_node))
    {
        if( ! is_seq(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
            _clear_type(dst_node);
            if(src->has_key(src_node))
                to_seq(dst_node, src->key(src_node));
            else
                to_seq(dst_node);
        }
        for(size_t sch = src->first_child(src_node); sch != NONE; sch = src->next_sibling(sch))
        {
            size_t dch = append_child(dst_node);
            _copy_props_wo_key(dch, src, sch);
            merge_with(src, sch, dch);
        }
    }
    else if(src->is_map(src_node))
    {
        if( ! is_map(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
            _clear_type(dst_node);
            if(src->has_key(src_node))
                to_map(dst_node, src->key(src_node));
            else
                to_map(dst_node);
        }
        for(size_t sch = src->first_child(src_node); sch != NONE; sch = src->next_sibling(sch))
        {
            size_t dch = find_child(dst_node, src->key(sch));
            if(dch == NONE)
            {
                dch = append_child(dst_node);
                _copy_props(dch, src, sch);
            }
            merge_with(src, sch, dch);
        }
    }
    else
    {
        C4_NEVER_REACH();
    }
}